

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::invalidate(HEkk *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x2550) = 0;
  *(undefined1 *)(in_RDI + 0x2553) = 0;
  invalidateBasisMatrix((HEkk *)0x7680b6);
  HighsSimplexStats::initialise((HighsSimplexStats *)(in_RDI + 0x38b0),0);
  return;
}

Assistant:

void HEkk::invalidate() {
  this->status_.initialised_for_new_lp = false;
  assert(!this->status_.is_dualized);
  assert(!this->status_.is_permuted);
  this->status_.initialised_for_solve = false;
  this->invalidateBasisMatrix();
  this->simplex_stats_.initialise();
}